

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

double filter_bessel(double x)

{
  undefined1 auVar1 [16];
  long i;
  long lVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double local_48;
  double dStack_40;
  
  dVar4 = 0.0;
  if ((x == 0.0) && (!NAN(x))) {
    return 0.7853981633974483;
  }
  dVar10 = x * 3.141592653589793;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar4 = -dVar10;
    if (-dVar10 <= dVar10) {
      dVar4 = dVar10;
    }
    if (8.0 <= dVar4) {
      dVar5 = 2.0 / (dVar4 * 3.141592653589793);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar13 = 8.0 / dVar4;
      dVar8 = 1.0;
      dVar9 = 1.2571716929145342;
      lVar2 = 4;
      do {
        dVar8 = dVar8 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Qone + lVar2 * 8);
        dVar9 = dVar9 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Pone + lVar2 * 8);
        bVar3 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar3);
      dVar6 = sin(dVar4);
      dVar7 = cos(dVar4);
      dVar11 = 1.0;
      auVar12._8_8_ = 0.03532840052740124;
      lVar2 = 4;
      do {
        dVar11 = dVar11 * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Qone + lVar2 * 8);
        auVar12._8_8_ =
             auVar12._8_8_ * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Pone + lVar2 * 8);
        bVar3 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar3);
      auVar12._0_8_ = 0xc020000000000000;
      auVar1._8_8_ = dVar11;
      auVar1._0_8_ = dVar4;
      auVar12 = divpd(auVar12,auVar1);
      dVar13 = sin(dVar4);
      dVar4 = cos(dVar4);
      local_48 = auVar12._0_8_;
      dStack_40 = auVar12._8_8_;
      dVar5 = dVar5 * (dStack_40 * local_48 * (dVar4 + dVar13) * -0.7071067811865475 +
                      (dVar6 - dVar7) * 0.7071067811865475 * (dVar9 / dVar8));
      dVar4 = (double)(-(ulong)(dVar10 < 0.0) & (ulong)-dVar5 |
                      ~-(ulong)(dVar10 < 0.0) & (ulong)dVar5);
    }
    else {
      dVar5 = 1.0;
      dVar8 = 2701.1227108923235;
      lVar2 = 7;
      do {
        dVar5 = dVar5 * dVar4 * dVar4 + *(double *)(KernelBessel_J1_Qone + lVar2 * 8);
        dVar8 = dVar8 * dVar4 * dVar4 + *(double *)(KernelBessel_J1_Pone + lVar2 * 8);
        bVar3 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar3);
      dVar4 = dVar10 * (dVar8 / dVar5);
    }
  }
  return dVar4 / (x + x);
}

Assistant:

static double filter_bessel(const double x)
{
	if (x == 0.0f)
		return (double)(M_PI/4.0f);
	return (KernelBessel_Order1((double)M_PI*x)/(2.0f*x));
}